

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2closest_edge_query_base.h
# Opt level: O3

void __thiscall
S2ClosestEdgeQueryBase<S2MinDistance>::FindClosestEdges
          (S2ClosestEdgeQueryBase<S2MinDistance> *this,Target *target,Options *options,
          vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
          *results)

{
  pointer *ppRVar1;
  btree_set<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256>
  *this_00;
  Storage<absl::container_internal::CompressedTuple<std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_*>,_2UL,_false>
  node;
  long lVar2;
  int32 iVar3;
  int32 iVar4;
  ulong uVar5;
  node_type *pnVar6;
  iterator __position;
  pointer pRVar7;
  pointer pRVar8;
  iterator iVar9;
  
  FindClosestEdgesInternal(this,target,options);
  pRVar8 = (results->
           super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (results->
       super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current != pRVar8) {
    (results->
    super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
    )._M_impl.super__Vector_impl_data._M_finish = pRVar8;
    __position._M_current = pRVar8;
  }
  if (options->max_results_ == 0x7fffffff) {
    pRVar8 = (this->result_vector_).
             super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pRVar7 = (this->result_vector_).
             super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar8 != pRVar7) {
      uVar5 = (long)pRVar7 - (long)pRVar8 >> 4;
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<S2ClosestEdgeQueryBase<S2MinDistance>::Result*,std::vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (pRVar8,pRVar7,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<S2ClosestEdgeQueryBase<S2MinDistance>::Result*,std::vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pRVar8,pRVar7);
      pRVar8 = (this->result_vector_).
               super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pRVar7 = (this->result_vector_).
               super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (pRVar8 != pRVar7) {
      std::
      __unique_copy<__gnu_cxx::__normal_iterator<S2ClosestEdgeQueryBase<S2MinDistance>::Result*,std::vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>>>,std::back_insert_iterator<std::vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                (pRVar8,pRVar7,results);
      pRVar8 = (this->result_vector_).
               super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pRVar7 = (this->result_vector_).
               super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    if (pRVar7 != pRVar8) {
      (this->result_vector_).
      super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar8;
    }
  }
  else if (options->max_results_ == 1) {
    if (-1 < (this->result_singleton_).shape_id_) {
      if (__position._M_current ==
          (results->
          super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>>
        ::_M_realloc_insert<S2ClosestEdgeQueryBase<S2MinDistance>::Result_const&>
                  ((vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>>
                    *)results,__position,&this->result_singleton_);
        return;
      }
      iVar3 = (this->result_singleton_).shape_id_;
      iVar4 = (this->result_singleton_).edge_id_;
      ((__position._M_current)->distance_).super_S1ChordAngle.length2_ =
           (this->result_singleton_).distance_.super_S1ChordAngle.length2_;
      (__position._M_current)->shape_id_ = iVar3;
      (__position._M_current)->edge_id_ = iVar4;
      ppRVar1 = &(results->
                 super__Vector_base<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      *ppRVar1 = *ppRVar1 + 1;
    }
  }
  else {
    this_00 = &this->result_set_;
    pnVar6 = gtl::internal_btree::
             btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
             ::leftmost((btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
                         *)this_00);
    iVar9 = gtl::internal_btree::
            btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
            ::end((btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
                   *)this_00);
    std::
    vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>>
    ::
    _M_assign_aux<gtl::internal_btree::btree_iterator<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,256,false>>,S2ClosestEdgeQueryBase<S2MinDistance>::Result&,S2ClosestEdgeQueryBase<S2MinDistance>::Result*>>
              ((vector<S2ClosestEdgeQueryBase<S2MinDistance>::Result,std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>>
                *)results,pnVar6,0,iVar9.node,iVar9.position);
    node.value = (this->result_set_).
                 super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
                 .
                 super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
                 .tree_.root_.
                 super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
                 .
                 super_Storage<absl::container_internal::CompressedTuple<std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_*>,_2UL,_false>
                 .value;
    if (node.value != (node_type *)0x0) {
      gtl::internal_btree::
      btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
      ::internal_clear((btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>
                        *)this_00,node.value);
    }
    (this_00->
    super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
    ).
    super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
    .tree_.root_.
    super_CompressedTupleImpl<absl::container_internal::CompressedTuple<std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_*>,_absl::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>_>
    .
    super_Storage<absl::container_internal::CompressedTuple<std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_*>,_2UL,_false>
    .value = (T)0x0;
    (this->result_set_).
    super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
    .
    super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
    .tree_.rightmost_ = (node_type *)0x0;
    (this->result_set_).
    super_btree_set_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
    .
    super_btree_container<gtl::internal_btree::btree<gtl::internal_btree::set_params<S2ClosestEdgeQueryBase<S2MinDistance>::Result,_std::less<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestEdgeQueryBase<S2MinDistance>::Result>,_256,_false>_>_>
    .tree_.size_ = 0;
  }
  return;
}

Assistant:

void S2ClosestEdgeQueryBase<Distance>::FindClosestEdges(
    Target* target, const Options& options,
    std::vector<Result>* results) {
  FindClosestEdgesInternal(target, options);
  results->clear();
  if (options.max_results() == 1) {
    if (result_singleton_.shape_id() >= 0) {
      results->push_back(result_singleton_);
    }
  } else if (options.max_results() == Options::kMaxMaxResults) {
    std::sort(result_vector_.begin(), result_vector_.end());
    std::unique_copy(result_vector_.begin(), result_vector_.end(),
                     std::back_inserter(*results));
    result_vector_.clear();
  } else {
    results->assign(result_set_.begin(), result_set_.end());
    result_set_.clear();
  }
}